

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PartialUnion.cpp
# Opt level: O0

void __thiscall
dgrminer::PartialUnion::addLabeledNodeOccurrence
          (PartialUnion *this,size_t node_index,int label,int changetime,
          vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_> *labeled_nodes,
          bool set_of_graphs,int occurrence)

{
  bool bVar1;
  pointer plVar2;
  mapped_type *pmVar3;
  pair<std::_Rb_tree_const_iterator<int>,_bool> pVar4;
  int local_1bc;
  _Base_ptr local_1b8;
  undefined1 local_1b0;
  int local_1a4;
  _Base_ptr local_1a0;
  undefined1 local_198;
  _Base_ptr local_190;
  undefined1 local_188;
  _Base_ptr local_180;
  undefined1 local_178;
  int local_16c;
  _Base_ptr local_168;
  undefined1 local_160;
  int local_154;
  _Base_ptr local_150;
  undefined1 local_148;
  __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
  local_140 [3];
  labeled_node local_128;
  __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
  local_b8;
  __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
  local_b0;
  __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
  local_a8;
  __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
  it;
  labeled_node ln;
  bool set_of_graphs_local;
  vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_> *labeled_nodes_local;
  int changetime_local;
  int label_local;
  size_t node_index_local;
  PartialUnion *this_local;
  
  ln.multiple_occurrences._M_h._M_single_bucket._7_1_ = set_of_graphs;
  labeled_node::labeled_node((labeled_node *)&it);
  it._M_current._0_4_ = changetime;
  it._M_current._4_4_ = label;
  local_b0._M_current =
       (labeled_node *)
       std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>::begin
                 (labeled_nodes);
  local_b8._M_current =
       (labeled_node *)
       std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>::end
                 (labeled_nodes);
  labeled_node::labeled_node(&local_128,(labeled_node *)&it);
  local_a8 = std::
             find_if<__gnu_cxx::__normal_iterator<dgrminer::labeled_node*,std::vector<dgrminer::labeled_node,std::allocator<dgrminer::labeled_node>>>,dgrminer::labeled_node>
                       (local_b0,local_b8,&local_128);
  labeled_node::~labeled_node(&local_128);
  local_140[0]._M_current =
       (labeled_node *)
       std::end<std::vector<dgrminer::labeled_node,std::allocator<dgrminer::labeled_node>>>
                 (labeled_nodes);
  bVar1 = __gnu_cxx::operator!=(&local_a8,local_140);
  changetime_local = (int)node_index;
  if (bVar1) {
    if ((this->new_measures & 1U) == 0) {
      if ((ln.multiple_occurrences._M_h._M_single_bucket._7_1_ & 1) == 0) {
        plVar2 = __gnu_cxx::
                 __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
                 ::operator->(&local_a8);
        pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          (&plVar2->occurrences,&occurrence);
        local_190 = (_Base_ptr)pVar4.first._M_node;
        local_188 = pVar4.second;
      }
      else {
        plVar2 = __gnu_cxx::
                 __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
                 ::operator->(&local_a8);
        local_16c = queryMappingSnapshotsToGraphs(this,occurrence);
        pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                          (&plVar2->occurrences,&local_16c);
        local_180 = (_Base_ptr)pVar4.first._M_node;
        local_178 = pVar4.second;
      }
    }
    else {
      plVar2 = __gnu_cxx::
               __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
               ::operator->(&local_a8);
      pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        (&plVar2->occurrences,&occurrence);
      local_150 = (_Base_ptr)pVar4.first._M_node;
      local_148 = pVar4.second;
      plVar2 = __gnu_cxx::
               __normal_iterator<dgrminer::labeled_node_*,_std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>_>
               ::operator->(&local_a8);
      pmVar3 = std::
               unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[](&plVar2->multiple_occurrences,&occurrence);
      local_154 = changetime_local;
      pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(pmVar3,&local_154);
      local_168 = (_Base_ptr)pVar4.first._M_node;
      local_160 = pVar4.second;
    }
  }
  else {
    if ((this->new_measures & 1U) == 0) {
      if ((ln.multiple_occurrences._M_h._M_single_bucket._7_1_ & 1) == 0) {
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)&ln,&occurrence);
      }
      else {
        local_1bc = queryMappingSnapshotsToGraphs(this,occurrence);
        std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                  ((set<int,_std::less<int>,_std::allocator<int>_> *)&ln,&local_1bc);
      }
    }
    else {
      pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert
                        ((set<int,_std::less<int>,_std::allocator<int>_> *)&ln,&occurrence);
      local_1a0 = (_Base_ptr)pVar4.first._M_node;
      local_198 = pVar4.second;
      pmVar3 = std::
               unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
               ::operator[]((unordered_map<int,_std::set<int,_std::less<int>,_std::allocator<int>_>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
                             *)&ln.occurrences._M_t._M_impl.super__Rb_tree_header._M_node_count,
                            &occurrence);
      local_1a4 = changetime_local;
      pVar4 = std::set<int,_std::less<int>,_std::allocator<int>_>::insert(pmVar3,&local_1a4);
      local_1b8 = (_Base_ptr)pVar4.first._M_node;
      local_1b0 = pVar4.second;
    }
    std::vector<dgrminer::labeled_node,_std::allocator<dgrminer::labeled_node>_>::push_back
              (labeled_nodes,(value_type *)&it);
  }
  labeled_node::~labeled_node((labeled_node *)&it);
  return;
}

Assistant:

void PartialUnion::addLabeledNodeOccurrence(
		size_t node_index,
		int label,
		int changetime,
		std::vector<labeled_node> & labeled_nodes,
		bool set_of_graphs,
		int occurrence
	) {
		labeled_node ln;
		ln.label = label; // nodes[i][PN_LABEL];
		ln.changetime = changetime; // nodes[i][PN_CHANGETIME];
		auto it = std::find_if(labeled_nodes.begin(), labeled_nodes.end(), ln);
		if (it != std::end(labeled_nodes))
		{
		  	if (new_measures) {
			  	it->occurrences.insert(occurrence);
				it->multiple_occurrences[occurrence].insert(node_index);
		  	}
		  	else  {
			  	if (set_of_graphs) {
					it->occurrences.insert(queryMappingSnapshotsToGraphs(occurrence));
				} else {
					it->occurrences.insert(occurrence);
				}
		  	}

		}
		else
		{
		  	if (new_measures) {
			  	ln.occurrences.insert(occurrence);
				ln.multiple_occurrences[occurrence].insert(node_index);
			} else {
			  	if (set_of_graphs) {
					ln.occurrences.insert(queryMappingSnapshotsToGraphs(occurrence));
				} else {
					ln.occurrences.insert(occurrence);
				}
		  	}

			labeled_nodes.push_back(ln);
		}
	}